

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_test.cc
# Opt level: O0

int main(int argc,char **argv)

{
  TestSuite test;
  _func_int *__f;
  char **in_stack_fffffffffffffef0;
  function<int_()> *this;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  TestSuite *in_stack_ffffffffffffff00;
  allocator local_e1;
  TestSuite *in_stack_ffffffffffffff20;
  undefined1 local_c0 [55];
  undefined1 local_89 [33];
  undefined1 local_68;
  int local_4;
  
  local_4 = 0;
  TestSuite::TestSuite
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef0);
  local_68 = 1;
  this = (function<int_()> *)local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_89 + 1),"multi thread test",(allocator *)this);
  __f = (_func_int *)local_c0;
  std::function<int()>::function<int(&)(),void>(this,__f);
  TestSuite::doTest(in_stack_ffffffffffffff00,
                    (string *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),this);
  std::function<int_()>::~function((function<int_()> *)0x10528e);
  std::__cxx11::string::~string((string *)(local_89 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff20,"function latency macro test",&local_e1);
  std::function<int()>::function<int(&)(),void>(this,__f);
  TestSuite::doTest(in_stack_ffffffffffffff00,
                    (string *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),this);
  std::function<int_()>::~function((function<int_()> *)0x105306);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  local_4 = 0;
  TestSuite::~TestSuite(in_stack_ffffffffffffff20);
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
    TestSuite test(argc, argv);;

    test.options.printTestMessage = true;
    test.doTest("multi thread test", MT_basic_insert_test);
    test.doTest("function latency macro test", latency_macro_test);

    return 0;
}